

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

bool fmp4_stream::set_track_id
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in,uint32_t track_id)

{
  ulong uVar1;
  uint32_t uVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  ulong local_20;
  size_t k;
  bool set_tkhd;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_10;
  uint32_t track_id_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in_local;
  
  k._3_1_ = 0;
  local_20 = 0;
  k._4_4_ = track_id;
  pvStack_10 = moov_in;
  while( true ) {
    uVar1 = local_20;
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_10);
    if (sVar4 - 0x10 <= uVar1) break;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (pvStack_10,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_40,(char *)pvVar5,&local_41);
    iVar3 = std::__cxx11::string::compare((char *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    if (iVar3 == 0) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pvStack_10,local_20 + 4);
      uVar2 = k._4_4_;
      if (*pvVar5 == '\x01') {
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (pvStack_10,local_20 + 0x18);
        anon_unknown.dwarf_15def::fmp4_write_uint32(uVar2,(char *)pvVar5);
      }
      else {
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (pvStack_10,local_20 + 0x10);
        anon_unknown.dwarf_15def::fmp4_write_uint32(uVar2,(char *)pvVar5);
      }
      k._3_1_ = 1;
    }
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (pvStack_10,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,(char *)pvVar5,&local_79);
    iVar3 = std::__cxx11::string::compare((char *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    if (iVar3 == 0) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pvStack_10,local_20 + 4);
      uVar2 = k._4_4_;
      if (*pvVar5 == '\x01') {
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (pvStack_10,local_20 + 0x18);
        anon_unknown.dwarf_15def::fmp4_write_uint32(uVar2,(char *)pvVar5);
      }
      else {
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (pvStack_10,local_20 + 0x10);
        anon_unknown.dwarf_15def::fmp4_write_uint32(uVar2,(char *)pvVar5);
      }
      k._3_1_ = 1;
    }
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool set_track_id(std::vector<uint8_t> &moov_in, uint32_t track_id)
	{
		bool set_tkhd = false;

		for (std::size_t k = 0; k < moov_in.size() - 16; k++)
		{
			if (std::string((char *)&moov_in[k]).compare("tkhd") == 0)
			{
				//cout << "tkhd found" << endl;
				if ((uint8_t)moov_in[k + 4] == 1)
				{
					// version 1 
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 24]);
					set_tkhd = true;
				}
				else {
					// version 0
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 16]);
					set_tkhd = true;
				}
			}
			if (std::string((char *)&moov_in[k]).compare("trex") == 0)
			{
				//cout << "tkhd found" << endl;
				if ((uint8_t)moov_in[k + 4] == 1)
				{
					// version 1 
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 24]);
					set_tkhd = true;
				}
				else {
					// version 0
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 16]);
					set_tkhd = true;
				}
			}
		}
		return true;
	}